

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_partition.h
# Opt level: O2

size_t embree::
       parallel_partitioning<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>
                 (uint *array,size_t begin,size_t end,int *identity,unsigned_long *leftReduction,
                 unsigned_long *rightReduction,anon_class_8_1_a8a30a3a *is_left,
                 anon_class_1_0_00000001 *reduction_t,anon_class_1_0_00000001 *reduction_v,
                 size_t BLOCK_SIZE)

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  size_t i;
  _Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
  _Var4;
  task *ptVar5;
  long lVar6;
  uint *puVar7;
  runtime_error *prVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  unsigned_long end_1;
  _func_int **pp_Var11;
  size_t sVar12;
  uint *l;
  uint *puVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  unsigned_long end_2;
  size_t sVar21;
  auto_partitioner local_129;
  size_t numMisplacedRangesLeft;
  _Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
  local_120;
  task_traits local_118;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  p;
  size_t numMisplacedItemsLeft;
  size_t numMisplacedRangesRight;
  int *local_f8;
  undefined1 local_f0 [56];
  undefined8 local_b8;
  task_group_context context;
  
  if (begin < 0x80) {
    puVar7 = array + begin;
    puVar13 = array;
    do {
      puVar7 = puVar7 + -1;
      lVar6 = (long)puVar13 - (long)array;
      for (; (puVar13 <= puVar7 && ((ulong)*puVar13 < *(ulong *)*rightReduction));
          puVar13 = puVar13 + 1) {
        *(ulong *)identity = *(long *)identity + (ulong)*puVar13;
        lVar6 = lVar6 + 4;
      }
      while( true ) {
        if (puVar7 < puVar13) {
          return lVar6 >> 2;
        }
        uVar10 = (ulong)*puVar7;
        if (uVar10 < *(ulong *)*rightReduction) break;
        *leftReduction = *leftReduction + uVar10;
        puVar7 = puVar7 + -1;
      }
      *(ulong *)identity = *(long *)identity + uVar10;
      *leftReduction = *leftReduction + (ulong)*puVar13;
      uVar3 = *puVar13;
      *puVar13 = *puVar7;
      *puVar7 = uVar3;
      puVar13 = puVar13 + 1;
    } while( true );
  }
  local_f8 = (int *)end;
  _Var4._M_head_impl =
       (parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>
        *)alignedMalloc(0x10c0,0x40);
  (_Var4._M_head_impl)->array = array;
  (_Var4._M_head_impl)->N = begin;
  (_Var4._M_head_impl)->is_left = (anon_class_8_1_a8a30a3a *)rightReduction;
  (_Var4._M_head_impl)->reduction_t = (anon_class_1_0_00000001 *)is_left;
  (_Var4._M_head_impl)->reduction_v = reduction_t;
  (_Var4._M_head_impl)->identity = local_f8;
  uVar3 = tbb::detail::d1::max_concurrency();
  pp_Var11 = (_func_int **)(begin + 0x7f >> 7);
  pp_Var9 = (_func_int **)0x40;
  if (uVar3 < 0x40) {
    pp_Var9 = (_func_int **)(ulong)uVar3;
  }
  if (pp_Var9 <= pp_Var11) {
    pp_Var11 = pp_Var9;
  }
  (_Var4._M_head_impl)->numTasks = (size_t)pp_Var11;
  local_120._M_head_impl = _Var4._M_head_impl;
  p._M_t.
  super___uniq_ptr_impl<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  .
  super__Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>,_true,_true>
        )(__uniq_ptr_data<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>,_true,_true>
          )_Var4._M_head_impl;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_118.m_version_and_traits = (uint64_t)&local_120;
  if (pp_Var11 != (_func_int **)0x0) {
    local_f0._0_8_ = (small_object_pool *)0x0;
    ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)local_f0,0xc0);
    ptVar5->m_reserved[3] = 0;
    ptVar5->m_reserved[4] = 0;
    ptVar5->m_reserved[5] = 0;
    ptVar5->m_reserved[1] = 0;
    ptVar5->m_reserved[2] = 0;
    (ptVar5->super_task_traits).m_version_and_traits = 0;
    ptVar5->m_reserved[0] = 0;
    ptVar5->_vptr_task = (_func_int **)&PTR__task_001920c0;
    ptVar5[1]._vptr_task = pp_Var11;
    ptVar5[1].super_task_traits.m_version_and_traits = 0;
    ptVar5[1].m_reserved[0] = 1;
    ptVar5[1].m_reserved[1] = (uint64_t)&local_118;
    ptVar5[1].m_reserved[2] = 0;
    ptVar5[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar5[1].m_reserved + 5),
               (auto_partitioner *)&numMisplacedRangesLeft);
    ptVar5[2].super_task_traits.m_version_and_traits = local_f0._0_8_;
    local_f0._32_8_ = (anon_class_1_0_00000001 *)0x0;
    local_f0._40_4_ = 1;
    local_f0._48_8_ = 1;
    local_b8 = 1;
    ptVar5[1].m_reserved[4] = (uint64_t)(local_f0 + 0x20);
    tbb::detail::r1::execute_and_wait(ptVar5,&context,(wait_context *)(local_f0 + 0x30),&context);
  }
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar2 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    (_Var4._M_head_impl)->counter_start[(_Var4._M_head_impl)->numTasks] = (_Var4._M_head_impl)->N;
    (_Var4._M_head_impl)->counter_left[(_Var4._M_head_impl)->numTasks] = 0;
    for (pp_Var11 = (_func_int **)0x0; pp_Var9 = (_func_int **)(_Var4._M_head_impl)->numTasks,
        pp_Var11 < pp_Var9; pp_Var11 = (_func_int **)((long)pp_Var11 + 1)) {
      *(unsigned_long *)identity =
           *(long *)identity + (_Var4._M_head_impl)->leftReductions[(long)pp_Var11];
      *leftReduction = *leftReduction + (_Var4._M_head_impl)->rightReductions[(long)pp_Var11];
    }
    sVar12 = (_Var4._M_head_impl)->counter_left[0];
    for (lVar6 = 0x51; (_func_int **)(lVar6 - 0x50U) < pp_Var9; lVar6 = lVar6 + 1) {
      sVar12 = sVar12 + (_Var4._M_head_impl)->counter_start[lVar6 + -8];
    }
    sVar1 = (_Var4._M_head_impl)->N;
    numMisplacedRangesLeft = 0;
    numMisplacedRangesRight = 0;
    numMisplacedItemsLeft = 0;
    sVar16 = 0;
    sVar14 = 0;
    sVar15 = 0;
    for (pp_Var11 = (_func_int **)0x0; pp_Var11 < pp_Var9;
        pp_Var11 = (_func_int **)((long)pp_Var11 + 1)) {
      sVar18 = (_Var4._M_head_impl)->counter_start[(long)pp_Var11];
      sVar19 = (_Var4._M_head_impl)->counter_left[(long)pp_Var11] + sVar18;
      sVar21 = 0;
      if (0 < (long)sVar19) {
        sVar21 = sVar19;
      }
      sVar20 = (_Var4._M_head_impl)->counter_start[(long)pp_Var11 + 1];
      if ((long)sVar12 < (long)(_Var4._M_head_impl)->counter_start[(long)pp_Var11 + 1]) {
        sVar20 = sVar12;
      }
      if ((long)sVar18 < (long)sVar12) {
        sVar18 = sVar12;
      }
      if ((long)sVar1 < (long)sVar19) {
        sVar19 = sVar1;
      }
      sVar17 = sVar15;
      if (sVar20 - sVar21 != 0 && (long)sVar21 <= (long)sVar20) {
        sVar16 = sVar16 + (sVar20 - sVar21);
        sVar17 = sVar15 + 1;
        (_Var4._M_head_impl)->leftMisplacedRanges[sVar15]._begin = sVar21;
        (_Var4._M_head_impl)->leftMisplacedRanges[sVar15]._end = sVar20;
        numMisplacedRangesLeft = sVar17;
        numMisplacedItemsLeft = sVar16;
      }
      sVar15 = sVar14;
      if ((long)sVar18 < (long)sVar19) {
        sVar15 = sVar14 + 1;
        (_Var4._M_head_impl)->rightMisplacedRanges[sVar14]._begin = sVar18;
        (_Var4._M_head_impl)->rightMisplacedRanges[sVar14]._end = sVar19;
        numMisplacedRangesRight = sVar15;
      }
      pp_Var9 = (_func_int **)(_Var4._M_head_impl)->numTasks;
      sVar14 = sVar15;
      sVar15 = sVar17;
    }
    if (sVar16 != 0) {
      local_f0._0_8_ = &numMisplacedItemsLeft;
      local_f0._16_8_ = &numMisplacedRangesLeft;
      local_f0._24_8_ = &numMisplacedRangesRight;
      local_f0._8_8_ = _Var4._M_head_impl;
      tbb::detail::d1::task_group_context::task_group_context
                (&context,(context_traits)0x4,CUSTOM_CTX);
      local_120._M_head_impl =
           (parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>
            *)local_f0;
      if (pp_Var9 != (_func_int **)0x0) {
        local_118.m_version_and_traits = 0;
        ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_118,0xc0);
        ptVar5->m_reserved[3] = 0;
        ptVar5->m_reserved[4] = 0;
        ptVar5->m_reserved[1] = 0;
        ptVar5->m_reserved[2] = 0;
        ptVar5->m_reserved[5] = 0;
        (ptVar5->super_task_traits).m_version_and_traits = 0;
        ptVar5->m_reserved[0] = 0;
        ptVar5->_vptr_task = (_func_int **)&PTR__task_00192108;
        ptVar5[1]._vptr_task = pp_Var9;
        ptVar5[1].super_task_traits.m_version_and_traits = 0;
        ptVar5[1].m_reserved[0] = 1;
        ptVar5[1].m_reserved[1] = (uint64_t)&local_120;
        ptVar5[1].m_reserved[2] = 0;
        ptVar5[1].m_reserved[3] = 1;
        tbb::detail::d1::auto_partition_type::auto_partition_type
                  ((auto_partition_type *)(ptVar5[1].m_reserved + 5),&local_129);
        ptVar5[2].super_task_traits.m_version_and_traits = local_118.m_version_and_traits;
        local_f0._32_8_ = (anon_class_1_0_00000001 *)0x0;
        local_f0._40_4_ = 1;
        local_f0._48_8_ = 1;
        local_b8 = 1;
        ptVar5[1].m_reserved[4] = (uint64_t)(local_f0 + 0x20);
        tbb::detail::r1::execute_and_wait
                  (ptVar5,&context,(wait_context *)(local_f0 + 0x30),&context);
      }
      cVar2 = tbb::detail::r1::is_group_execution_cancelled(&context);
      if (cVar2 != '\0') {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"task cancelled");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context);
    }
    std::
    unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>_>_>
    ::~unique_ptr(&p);
    return sVar12;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"task cancelled");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline size_t parallel_partitioning(T* array, 
                                            const size_t begin,
                                            const size_t end, 
                                            const Vi &identity,
                                            V &leftReduction,
                                            V &rightReduction,
                                            const IsLeft& is_left, 
                                            const Reduction_T& reduction_t,
                                            const Reduction_V& reduction_v,
                                            size_t BLOCK_SIZE = 128)
  {
    /* fall back to single threaded partitioning for small N */
    if (unlikely(end-begin < BLOCK_SIZE))
      return serial_partitioning(array,begin,end,leftReduction,rightReduction,is_left,reduction_t);

    /* otherwise use parallel code */
    else {
      typedef parallel_partition_task<T,V,Vi,IsLeft,Reduction_T,Reduction_V> partition_task;
      std::unique_ptr<partition_task> p(new partition_task(&array[begin],end-begin,identity,is_left,reduction_t,reduction_v,BLOCK_SIZE));
      return begin+p->partition(leftReduction,rightReduction);    
    }
  }